

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

const_iterator
cmRemoveIndices<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *r,Range<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *rem)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  unsigned_long *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  bool bVar14;
  
  puVar10 = (rem->Begin)._M_current;
  puVar1 = (rem->End)._M_current;
  pbVar13 = (r->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    pbVar5 = (r->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + *puVar10;
    lVar7 = 1;
    if (puVar10 + 1 != puVar1 && pbVar5 != pbVar13) {
      lVar9 = -0x20;
      lVar6 = 0;
      uVar8 = *puVar10;
      puVar10 = puVar10 + 2;
      pbVar4 = pbVar5;
      do {
        pbVar11 = pbVar4;
        uVar2 = puVar10[-1];
        lVar12 = uVar2 - uVar8;
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (pbVar5,(long)&pbVar5[1]._M_dataplus._M_p + lVar6,pbVar11 + lVar12);
        lVar3 = uVar8 * -0x20;
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pbVar11[uVar2 - uVar8]._M_dataplus._M_p + lVar9);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
        if (pbVar5 == pbVar13) break;
        lVar9 = lVar9 + -0x20;
        bVar14 = puVar10 != puVar1;
        uVar8 = uVar2;
        puVar10 = puVar10 + 1;
        pbVar4 = pbVar11 + lVar12;
      } while (bVar14);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pbVar11 + ((lVar3 + uVar2 * 0x20) - lVar6));
    }
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (pbVar5,pbVar5 + lVar7,pbVar13);
    pbVar13 = pbVar13 + -lVar7;
  }
  return (const_iterator)pbVar13;
}

Assistant:

const_iterator begin() const { return Begin; }